

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

ssize_t __thiscall icu_63::VTimeZone::write(VTimeZone *this,int __fd,void *__buf,size_t __n)

{
  UBool UVar1;
  int32_t iVar2;
  undefined7 extraout_var;
  UnicodeString *pUVar3;
  long *plVar4;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  InitialTimeZoneRule *size;
  VTZWriter *in_XMM0_Qa;
  UnicodeString *local_190;
  TimeZoneRule *tr_1;
  undefined1 local_139;
  UnicodeString *local_138;
  UnicodeString *local_130;
  UnicodeString *icutzprop;
  TimeZoneRule *tr;
  RuleBasedTimeZone rbtz;
  undefined1 local_a0 [8];
  UnicodeString tzid;
  UVector customProps;
  UVector *transitionRules;
  InitialTimeZoneRule *initial;
  UErrorCode *status_local;
  VTZWriter *writer_local;
  UDate start_local;
  VTimeZone *this_local;
  
  status_local = (UErrorCode *)CONCAT44(in_register_00000034,__fd);
  initial = (InitialTimeZoneRule *)__buf;
  writer_local = in_XMM0_Qa;
  start_local = (UDate)this;
  UVar1 = ::U_FAILURE(*__buf);
  if (UVar1 != '\0') {
    return CONCAT71(extraout_var,UVar1);
  }
  transitionRules = (UVector *)0x0;
  customProps.comparer = (UElementsAreEqual *)0x0;
  UVector::UVector((UVector *)((long)&tzid.fUnion + 0x30),uprv_deleteUObject_63,
                   uhash_compareUnicodeString_63,(UErrorCode *)initial);
  UnicodeString::UnicodeString((UnicodeString *)local_a0);
  BasicTimeZone::getTimeZoneRulesAfter
            (&this->super_BasicTimeZone,(UDate)writer_local,(InitialTimeZoneRule **)&transitionRules
             ,(UVector **)&customProps.comparer,(UErrorCode *)initial);
  UVar1 = ::U_FAILURE(*(UErrorCode *)&(initial->super_TimeZoneRule).super_UObject._vptr_UObject);
  if (UVar1 != '\0') {
    rbtz.fUpToDate = '\x01';
    rbtz._105_3_ = 0;
    goto LAB_00259db7;
  }
  TimeZone::getID((TimeZone *)this,(UnicodeString *)local_a0);
  RuleBasedTimeZone::RuleBasedTimeZone
            ((RuleBasedTimeZone *)&tr,(UnicodeString *)local_a0,
             (InitialTimeZoneRule *)transitionRules);
  if (customProps.comparer == (UElementsAreEqual *)0x0) {
LAB_00259a5b:
    size = initial;
    RuleBasedTimeZone::complete((RuleBasedTimeZone *)&tr,(UErrorCode *)initial);
    UVar1 = ::U_FAILURE(*(UErrorCode *)&(initial->super_TimeZoneRule).super_UObject._vptr_UObject);
    if (UVar1 != '\0') goto LAB_00259ce4;
    iVar2 = UnicodeString::length(&this->olsonzid);
    if ((0 < iVar2) && (iVar2 = UnicodeString::length(&this->icutzver), 0 < iVar2)) {
      pUVar3 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)size);
      local_139 = 0;
      local_190 = (UnicodeString *)0x0;
      if (pUVar3 != (UnicodeString *)0x0) {
        local_139 = 1;
        local_138 = pUVar3;
        UnicodeString::UnicodeString(pUVar3,(UChar *)ICU_TZINFO_PROP);
        local_190 = pUVar3;
      }
      local_130 = local_190;
      UnicodeString::append(local_190,&this->olsonzid);
      UnicodeString::append(local_130,L'[');
      UnicodeString::append(local_130,&this->icutzver);
      pUVar3 = local_130;
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&tr_1,(char16_t *)ICU_TZINFO_PARTIAL);
      UnicodeString::append(pUVar3,(ConstChar16Ptr *)&tr_1,-1);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&tr_1);
      appendMillis((UDate)writer_local,local_130);
      UnicodeString::append(local_130,L']');
      UVector::addElement((UVector *)((long)&tzid.fUnion + 0x30),local_130,(UErrorCode *)initial);
      UVar1 = ::U_FAILURE(*(UErrorCode *)&(initial->super_TimeZoneRule).super_UObject._vptr_UObject)
      ;
      if (UVar1 != '\0') {
        if (local_130 != (UnicodeString *)0x0) {
          (*(local_130->super_Replaceable).super_UObject._vptr_UObject[1])();
        }
        goto LAB_00259ce4;
      }
    }
    writeZone(this,(VTZWriter *)status_local,(BasicTimeZone *)&tr,
              (UVector *)((long)&tzid.fUnion + 0x30),(UErrorCode *)initial);
    rbtz.fUpToDate = '\x01';
    rbtz._105_3_ = 0;
  }
  else {
    do {
      UVar1 = UVector::isEmpty((UVector *)customProps.comparer);
      if (UVar1 != '\0') {
        if (customProps.comparer != (UElementsAreEqual *)0x0) {
          (**(code **)(*(long *)customProps.comparer + 8))();
        }
        customProps.comparer = (UElementsAreEqual *)0x0;
        goto LAB_00259a5b;
      }
      icutzprop = (UnicodeString *)UVector::orphanElementAt((UVector *)customProps.comparer,0);
      RuleBasedTimeZone::addTransitionRule
                ((RuleBasedTimeZone *)&tr,(TimeZoneRule *)icutzprop,(UErrorCode *)initial);
      UVar1 = ::U_FAILURE(*(UErrorCode *)&(initial->super_TimeZoneRule).super_UObject._vptr_UObject)
      ;
    } while (UVar1 == '\0');
LAB_00259ce4:
    if ((transitionRules != (UVector *)0x0) && (transitionRules != (UVector *)0x0)) {
      (*(transitionRules->super_UObject)._vptr_UObject[1])();
    }
    if (customProps.comparer != (UElementsAreEqual *)0x0) {
      while (UVar1 = UVector::isEmpty((UVector *)customProps.comparer), UVar1 == '\0') {
        plVar4 = (long *)UVector::orphanElementAt((UVector *)customProps.comparer,0);
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 8))();
        }
      }
      if (customProps.comparer != (UElementsAreEqual *)0x0) {
        (**(code **)(*(long *)customProps.comparer + 8))();
      }
    }
    rbtz.fUpToDate = '\0';
    rbtz._105_3_ = 0;
  }
  RuleBasedTimeZone::~RuleBasedTimeZone((RuleBasedTimeZone *)&tr);
LAB_00259db7:
  UnicodeString::~UnicodeString((UnicodeString *)local_a0);
  UVector::~UVector((UVector *)((long)&tzid.fUnion + 0x30));
  return extraout_RAX;
}

Assistant:

void
VTimeZone::write(UDate start, VTZWriter& writer, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    InitialTimeZoneRule *initial = NULL;
    UVector *transitionRules = NULL;
    UVector customProps(uprv_deleteUObject, uhash_compareUnicodeString, status);
    UnicodeString tzid;

    // Extract rules applicable to dates after the start time
    getTimeZoneRulesAfter(start, initial, transitionRules, status);
    if (U_FAILURE(status)) {
        return;
    }

    // Create a RuleBasedTimeZone with the subset rule
    getID(tzid);
    RuleBasedTimeZone rbtz(tzid, initial);
    if (transitionRules != NULL) {
        while (!transitionRules->isEmpty()) {
            TimeZoneRule *tr = (TimeZoneRule*)transitionRules->orphanElementAt(0);
            rbtz.addTransitionRule(tr, status);
            if (U_FAILURE(status)) {
                goto cleanupWritePartial;
            }
        }
        delete transitionRules;
        transitionRules = NULL;
    }
    rbtz.complete(status);
    if (U_FAILURE(status)) {
        goto cleanupWritePartial;
    }

    if (olsonzid.length() > 0 && icutzver.length() > 0) {
        UnicodeString *icutzprop = new UnicodeString(ICU_TZINFO_PROP);
        icutzprop->append(olsonzid);
        icutzprop->append((UChar)0x005B/*'['*/);
        icutzprop->append(icutzver);
        icutzprop->append(ICU_TZINFO_PARTIAL, -1);
        appendMillis(start, *icutzprop);
        icutzprop->append((UChar)0x005D/*']'*/);
        customProps.addElement(icutzprop, status);
        if (U_FAILURE(status)) {
            delete icutzprop;
            goto cleanupWritePartial;
        }
    }
    writeZone(writer, rbtz, &customProps, status);
    return;

cleanupWritePartial:
    if (initial != NULL) {
        delete initial;
    }
    if (transitionRules != NULL) {
        while (!transitionRules->isEmpty()) {
            TimeZoneRule *tr = (TimeZoneRule*)transitionRules->orphanElementAt(0);
            delete tr;
        }
        delete transitionRules;
    }
}